

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_sequential_decoder.cc
# Opt level: O0

bool __thiscall
draco::PointCloudSequentialDecoder::CreateAttributesDecoder
          (PointCloudSequentialDecoder *this,int32_t att_decoder_id)

{
  byte bVar1;
  ValueType VVar2;
  PointCloud *this_00;
  PointCloudDecoder *in_RDI;
  pointer in_stack_ffffffffffffff78;
  LinearSequencer *in_stack_ffffffffffffff80;
  unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> *this_01;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  SequentialAttributeDecodersController *this_02;
  undefined4 in_stack_ffffffffffffff98;
  
  operator_new(0x80);
  operator_new(0x18);
  this_00 = PointCloudDecoder::point_cloud(in_RDI);
  VVar2 = PointCloud::num_points(this_00);
  LinearSequencer::LinearSequencer
            (in_stack_ffffffffffffff80,(int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  this_02 = (SequentialAttributeDecodersController *)&stack0xffffffffffffffd8;
  std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::
  unique_ptr<std::default_delete<draco::PointsSequencer>,void>
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  SequentialAttributeDecodersController::SequentialAttributeDecodersController
            (this_02,(unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                      *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::unique_ptr<draco::AttributesDecoder,std::default_delete<draco::AttributesDecoder>>::
  unique_ptr<std::default_delete<draco::AttributesDecoder>,void>
            ((unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> *
             )in_stack_ffffffffffffff80,(pointer)&stack0xffffffffffffffe0);
  this_01 = (unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> *)
            &stack0xffffffffffffffe8;
  std::
  unique_ptr<draco::AttributesDecoderInterface,std::default_delete<draco::AttributesDecoderInterface>>
  ::unique_ptr<draco::AttributesDecoder,std::default_delete<draco::AttributesDecoder>,void>
            ((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
              *)this_02,
             (unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_> *
             )CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar1 = PointCloudDecoder::SetAttributesDecoder
                    ((PointCloudDecoder *)CONCAT44(VVar2,in_stack_ffffffffffffff98),
                     (int)((ulong)this_02 >> 0x20),
                     (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                      *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  std::
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  ::~unique_ptr((unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                 *)this_02);
  std::unique_ptr<draco::AttributesDecoder,_std::default_delete<draco::AttributesDecoder>_>::
  ~unique_ptr(this_01);
  std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::~unique_ptr
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             this_01);
  return (bool)(bVar1 & 1);
}

Assistant:

bool PointCloudSequentialDecoder::CreateAttributesDecoder(
    int32_t att_decoder_id) {
  // Always create the basic attribute decoder.
  return SetAttributesDecoder(
      att_decoder_id,
      std::unique_ptr<AttributesDecoder>(
          new SequentialAttributeDecodersController(
              std::unique_ptr<PointsSequencer>(
                  new LinearSequencer(point_cloud()->num_points())))));
}